

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~dense_hashtable(dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Identity,_google::dense_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this)

{
  void *pvVar1;
  pointer pcVar2;
  pointer __ptr;
  size_type sVar3;
  long lVar4;
  
  __ptr = this->table;
  if (__ptr != (pointer)0x0) {
    sVar3 = this->num_buckets;
    if (sVar3 != 0) {
      lVar4 = 0x10;
      do {
        pvVar1 = *(void **)((long)this->table + lVar4 + -0x10);
        if ((void *)((long)&(this->table->_M_dataplus)._M_p + lVar4) != pvVar1) {
          operator_delete(pvVar1);
        }
        lVar4 = lVar4 + 0x20;
        sVar3 = sVar3 - 1;
      } while (sVar3 != 0);
      __ptr = this->table;
    }
    free(__ptr);
  }
  pcVar2 = (this->key_info).empty_key._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->key_info).empty_key.field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->key_info).delkey._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->key_info).delkey.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~dense_hashtable() {
    if (table) {
      destroy_buckets(0, num_buckets);
      val_info.deallocate(table, num_buckets);
    }
  }